

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<signed_char> min,WrappedType<signed_char> max,float gridSize)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  byte bVar7;
  WrappedType<signed_char> WVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  char cVar16;
  ulong uVar17;
  char cVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  deRandom rnd;
  int local_a4;
  uint local_9c;
  ulong local_98;
  char local_84;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  uVar17 = (ulong)(uint)stride;
  if (stride == 0) {
    uVar17 = (ulong)(uint)componentCount;
  }
  iVar13 = (int)uVar17;
  local_40 = (ulong)(uint)(iVar13 * 2);
  iVar6 = iVar13 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar22 = (float)(int)max.m_value - (float)(int)min.m_value;
    uVar20 = -(uint)(-fVar22 <= fVar22);
    bVar15 = (byte)(int)((float)(~uVar20 & (uint)-fVar22 | (uint)fVar22 & uVar20) * gridSize);
    bVar7 = 4;
    if ('\x04' < (char)bVar15) {
      bVar7 = bVar15;
    }
    if (0 < count) {
      local_38 = local_70 + offset;
      uVar20 = (int)max.m_value - (int)min.m_value;
      iVar14 = (int)(char)bVar7;
      local_50 = (ulong)(uint)(iVar13 * 3);
      local_58 = (ulong)(uint)(iVar13 * 4);
      local_60 = (ulong)(uint)(iVar13 * 5);
      local_a4 = 2;
      iVar13 = 3;
      local_98 = 0;
      local_68 = (ulong)(uint)count;
      local_48 = uVar17;
      do {
        local_9c = 0;
        while( true ) {
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_80);
            WVar8.m_value = (char)(dVar2 % uVar20) + min.m_value;
          }
          cVar4 = WVar8.m_value - WVar8.m_value % (char)bVar7;
          bVar10 = max.m_value - cVar4 & 0x7f;
          bVar15 = bVar7;
          if (bVar7 < bVar10) {
            dVar2 = deRandom_getUint32(&local_80);
            bVar15 = (char)(dVar2 % ((uint)bVar10 - iVar14)) + bVar7;
          }
          local_84 = (char)bVar15 % (char)bVar7;
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_80);
            WVar8.m_value = (char)(dVar2 % uVar20) + min.m_value;
          }
          cVar18 = WVar8.m_value - WVar8.m_value % (char)bVar7;
          bVar11 = max.m_value - cVar18 & 0x7f;
          bVar10 = bVar7;
          if (bVar7 < bVar11) {
            dVar2 = deRandom_getUint32(&local_80);
            bVar10 = (char)(dVar2 % ((uint)bVar11 - iVar14)) + bVar7;
          }
          if (componentCount < 3) {
            cVar12 = '\0';
          }
          else {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar2 = deRandom_getUint32(&local_80);
              WVar8.m_value = (char)(dVar2 % uVar20) + min.m_value;
            }
            cVar12 = WVar8.m_value - WVar8.m_value % (char)bVar7;
          }
          cVar5 = '\x01';
          if (3 < componentCount) {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar2 = deRandom_getUint32(&local_80);
              WVar8.m_value = (char)(dVar2 % uVar20) + min.m_value;
            }
            cVar5 = WVar8.m_value - WVar8.m_value % (char)bVar7;
          }
          cVar19 = bVar10 - (char)bVar10 % (char)bVar7;
          if ((componentCount < 3) ||
             (((fVar22 = (float)(int)cVar12 + (float)(int)(char)(bVar15 - local_84),
               uVar21 = -(uint)(-fVar22 <= fVar22),
               (float)iVar14 <= (float)(~uVar21 & (uint)-fVar22 | (uint)fVar22 & uVar21) &&
               (fVar22 = (float)(int)cVar5 + (float)(int)cVar19, uVar21 = -(uint)(-fVar22 <= fVar22)
               , (float)iVar14 <= (float)(~uVar21 & (uint)-fVar22 | (uint)fVar22 & uVar21))) ||
              (2 < local_9c)))) break;
          local_9c = local_9c + 1;
        }
        iVar3 = iVar6 * (int)local_98;
        iVar1 = (int)local_48;
        cVar16 = (bVar15 - local_84) + cVar4;
        local_38[iVar3] = cVar4;
        local_38[(long)iVar3 + 1] = cVar18;
        local_38[iVar3 + iVar1] = cVar16;
        local_38[iVar3 + 1 + iVar1] = cVar18;
        cVar19 = cVar19 + cVar18;
        lVar9 = (long)((int)local_40 + iVar3);
        local_38[lVar9] = cVar4;
        local_38[lVar9 + 1] = cVar19;
        local_38[iVar3 + (int)local_50] = cVar4;
        local_38[iVar3 + 1 + (int)local_50] = cVar19;
        lVar9 = (long)(iVar3 + (int)local_58);
        local_38[lVar9] = cVar16;
        local_38[lVar9 + 1] = cVar18;
        local_38[iVar3 + (int)local_60] = cVar16;
        local_38[iVar3 + (int)local_60 + 1] = cVar19;
        if (2 < componentCount) {
          lVar9 = 6;
          iVar3 = local_a4;
          do {
            local_38[iVar3] = cVar12;
            iVar3 = iVar3 + iVar1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (3 < componentCount) {
          lVar9 = 6;
          iVar3 = iVar13;
          do {
            local_38[iVar3] = cVar5;
            iVar3 = iVar3 + iVar1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        local_98 = local_98 + 1;
        local_a4 = local_a4 + iVar6;
        iVar13 = iVar13 + iVar6;
      } while (local_98 != local_68);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}